

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

uint64_t assembler::anon_unknown_0::
         execute_operation_const<assembler::(anonymous_namespace)::AndOper>
                   (operand operand1,operand operand2,uint64_t operand1_mem,uint64_t operand2_mem,
                   registers *regs)

{
  uint8_t *puVar1;
  logic_error *this;
  uint8_t *oprnd2_8_1;
  byte *pbStack_58;
  uint8_t left_1;
  uint8_t *oprnd1_8;
  uint8_t *oprnd2_8;
  uint64_t *oprnd2;
  uint64_t left;
  uint64_t *oprnd1;
  registers *regs_local;
  uint64_t operand2_mem_local;
  uint64_t operand1_mem_local;
  operand operand2_local;
  operand operand1_local;
  
  oprnd1 = &regs->rax;
  regs_local = (registers *)operand2_mem;
  operand2_mem_local = operand1_mem;
  operand1_mem_local._0_4_ = operand2;
  operand1_mem_local._4_4_ = operand1;
  left = (uint64_t)get_address_64bit(operand1,operand1_mem,regs);
  if ((uint64_t *)left == (uint64_t *)0x0) {
    pbStack_58 = get_address_8bit(operand1_mem_local._4_4_,operand2_mem_local,(registers *)oprnd1);
    oprnd2_8_1._7_1_ = *pbStack_58;
    if (pbStack_58 == (byte *)0x0) {
LAB_0014f19f:
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Invalid bytecode");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    puVar1 = get_address_8bit((operand)operand1_mem_local,(uint64_t)regs_local,(registers *)oprnd1);
    if (puVar1 == (uint8_t *)0x0) {
      if ((operand)operand1_mem_local != NUMBER) goto LAB_0014f19f;
      AndOper::apply((uint8_t *)((long)&oprnd2_8_1 + 7),(uint64_t)regs_local);
      _operand2_local = (uint64_t *)(ulong)oprnd2_8_1._7_1_;
    }
    else {
      AndOper::apply((uint8_t *)((long)&oprnd2_8_1 + 7),*puVar1);
      _operand2_local = (uint64_t *)(ulong)oprnd2_8_1._7_1_;
    }
  }
  else {
    oprnd2 = *(uint64_t **)left;
    oprnd2_8 = (uint8_t *)
               get_address_64bit((operand)operand1_mem_local,(uint64_t)regs_local,
                                 (registers *)oprnd1);
    if ((uint64_t *)oprnd2_8 == (uint64_t *)0x0) {
      if (((operand)operand1_mem_local == NUMBER) || ((operand)operand1_mem_local == LABELADDRESS))
      {
        AndOper::apply((uint64_t *)&oprnd2,(uint64_t)regs_local);
        _operand2_local = oprnd2;
      }
      else {
        oprnd1_8 = get_address_8bit((operand)operand1_mem_local,(uint64_t)regs_local,
                                    (registers *)oprnd1);
        if (oprnd1_8 == (uint8_t *)0x0) {
          oprnd1_8 = (uint8_t *)0x0;
          goto LAB_0014f19f;
        }
        AndOper::apply((uint64_t *)&oprnd2,*oprnd1_8);
        _operand2_local = oprnd2;
      }
    }
    else {
      AndOper::apply((uint64_t *)&oprnd2,*(uint64_t *)oprnd2_8);
      _operand2_local = oprnd2;
    }
  }
  return (uint64_t)_operand2_local;
}

Assistant:

inline uint64_t execute_operation_const(asmcode::operand operand1,
    asmcode::operand operand2,
    uint64_t operand1_mem,
    uint64_t operand2_mem,
    registers& regs)
    {
    uint64_t* oprnd1 = get_address_64bit(operand1, operand1_mem, regs);
    if (oprnd1)
      {
      uint64_t left = *oprnd1;
      uint64_t* oprnd2 = get_address_64bit(operand2, operand2_mem, regs);
      if (oprnd2)
        {
        TOper::apply(left, *oprnd2);
        return left;
        }
      else if (operand2 == asmcode::NUMBER || operand2 == asmcode::LABELADDRESS)
        {
        TOper::apply(left, operand2_mem);
        return left;
        }
      else
        {
        uint8_t* oprnd2_8 = get_address_8bit(operand2, operand2_mem, regs);
        if (oprnd2_8)
          {
          TOper::apply(left, *oprnd2_8);
          return left;
          }
        }
      }
    else
      {
      uint8_t* oprnd1_8 = get_address_8bit(operand1, operand1_mem, regs);
      uint8_t left = *oprnd1_8;
      if (oprnd1_8)
        {
        uint8_t* oprnd2_8 = get_address_8bit(operand2, operand2_mem, regs);
        if (oprnd2_8)
          {
          TOper::apply(left, *oprnd2_8);
          return (uint64_t)left;
          }
        else if (operand2 == asmcode::NUMBER)
          {
          TOper::apply(left, operand2_mem);
          return (uint64_t)left;
          }
        }
      }
    throw std::logic_error("Invalid bytecode");
    }